

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestGenericHandler::StartLogFile
          (cmCTestGenericHandler *this,char *name,cmGeneratedFileStream *xofs)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  mapped_type *this_00;
  allocator<char> local_3c9;
  cmAlphaNum local_3c8;
  string local_398;
  key_type local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  ostringstream cmCTestLog_msg_1;
  char *local_310;
  ostringstream ostr;
  
  if (name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
    poVar3 = std::operator<<((ostream *)&ostr,"Cannot create log file without providing the name");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0xa0,_cmCTestLog_msg_1,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
    bVar2 = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
    poVar3 = std::operator<<((ostream *)&ostr,"Last");
    std::operator<<(poVar3,name);
    if (0 < this->SubmitIndex) {
      poVar3 = std::operator<<((ostream *)&ostr,"_");
      std::ostream::operator<<(poVar3,this->SubmitIndex);
    }
    cmCTest::GetCurrentTag_abi_cxx11_((string *)&cmCTestLog_msg_1,this->CTest);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    if (local_310 != (char *)0x0) {
      poVar3 = std::operator<<((ostream *)&ostr,"_");
      cmCTest::GetCurrentTag_abi_cxx11_((string *)&cmCTestLog_msg_1,this->CTest);
      std::operator<<(poVar3,(string *)&cmCTestLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    }
    std::operator<<((ostream *)&ostr,".log");
    cmCTest::GetBinaryDir_abi_cxx11_(&local_398,this->CTest);
    _cmCTestLog_msg_1 = (pointer)local_398._M_string_length;
    local_3c8.View_._M_len = (size_t)&DAT_00000013;
    local_3c8.View_._M_str = "/Testing/Temporary/";
    std::__cxx11::stringbuf::str();
    cmStrCat<std::__cxx11::string>(&local_338,(cmAlphaNum *)&cmCTestLog_msg_1,&local_3c8,&local_358)
    ;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,name,&local_3c9);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->LogFileNames,&local_378);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_338);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_398);
    pcVar1 = this->CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCTestLog_msg_1,"Temporary",(allocator<char> *)&local_338);
    std::__cxx11::stringbuf::str();
    bVar2 = cmCTest::OpenOutputFile
                      (pcVar1,(string *)&cmCTestLog_msg_1,(string *)&local_3c8,xofs,false);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_1);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_1);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg_1,"Cannot create log file: ");
      std::__cxx11::stringbuf::str();
      poVar3 = std::operator<<(poVar3,(string *)&local_3c8);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_3c8);
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                   ,0xb0,(char *)local_3c8.View_._M_len,false);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
  }
  return bVar2;
}

Assistant:

bool cmCTestGenericHandler::StartLogFile(const char* name,
                                         cmGeneratedFileStream& xofs)
{
  if (!name) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file without providing the name"
                 << std::endl;);
    return false;
  }
  std::ostringstream ostr;
  ostr << "Last" << name;
  if (this->SubmitIndex > 0) {
    ostr << "_" << this->SubmitIndex;
  }
  if (!this->CTest->GetCurrentTag().empty()) {
    ostr << "_" << this->CTest->GetCurrentTag();
  }
  ostr << ".log";
  this->LogFileNames[name] =
    cmStrCat(this->CTest->GetBinaryDir(), "/Testing/Temporary/", ostr.str());
  if (!this->CTest->OpenOutputFile("Temporary", ostr.str(), xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: " << ostr.str() << std::endl);
    return false;
  }
  return true;
}